

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void pnga_scale_patch(Integer g_a,Integer *lo,Integer *hi,void *alpha)

{
  undefined1 auVar1 [16];
  double dVar2;
  char *pcVar3;
  int iVar4;
  logical lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  char *src_data_ptr;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  Integer bunit [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_550;
  undefined8 local_548;
  long lStack_540;
  undefined1 local_538 [40];
  undefined8 uStack_510;
  long local_508 [8];
  long local_4c8;
  long local_4c0 [9];
  Integer *local_478;
  Integer *local_470;
  long local_468 [8];
  long local_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_478 = lo;
  local_470 = hi;
  pnga_nodeid();
  bVar16 = _ga_sync_begin != 0;
  uStack_510._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar16) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_4c8,local_4c0,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar4 = pnga_local_iterator_next(&local_330,local_508,local_4c0 + 1,&local_550,local_3e8);
  lVar11 = local_4c0[0];
  do {
    if (iVar4 == 0) {
      if (uStack_510._4_4_ != 0) {
        pnga_sync();
      }
      return;
    }
    local_4c0[0] = lVar11;
    if (0 < lVar11) {
      memcpy(alStack_3b0 + 1,local_508,lVar11 * 8);
    }
    lVar5 = pnga_patch_intersect(local_478,local_470,local_508,local_4c0 + 1,lVar11);
    if (lVar5 != 0) {
      if (0 < lVar11) {
        lVar6 = 0;
LAB_00169d77:
        if (local_508[lVar6] <= alStack_3b0[lVar6 + 1]) break;
        if (lVar11 == 1) {
          lVar6 = 1;
          lVar14 = 0;
        }
        else {
          lVar6 = 1;
          lVar7 = 0;
          lVar14 = 0;
          do {
            lVar14 = lVar14 + (local_508[lVar7] - alStack_3b0[lVar7 + 1]) * lVar6;
            lVar6 = lVar6 * local_3e8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar11 + -1 != lVar7);
        }
        if (local_4c8 - 0x3e9U < 0x10) {
          lVar14 = ((&uStack_510)[lVar11] - alStack_3b0[lVar11]) * lVar6 + lVar14;
          switch(local_4c8) {
          case 0x3e9:
          case 0x3eb:
            lVar14 = lVar14 * 4;
            break;
          case 0x3ea:
          case 0x3ec:
          case 0x3ee:
          case 0x3f8:
            lVar14 = lVar14 * 8;
            break;
          default:
            goto switchD_00169e0b_caseD_3ed;
          case 0x3ef:
            lVar14 = lVar14 * 0x10;
          }
          local_550 = local_550 + lVar14;
        }
        else {
switchD_00169e0b_caseD_3ed:
          pnga_error(" wrong data type ",local_4c8);
        }
      }
LAB_00169e30:
      lVar6 = local_4c0[0];
      lVar11 = local_4c8;
      pcVar3 = local_550;
      lVar14 = 1;
      if (1 < local_4c0[0]) {
        lVar7 = 1;
        do {
          lVar14 = lVar14 * ((local_4c0[lVar7 + 1] - local_508[lVar7]) + 1);
          lVar7 = lVar7 + 1;
        } while (local_4c0[0] != lVar7);
      }
      local_548 = 0;
      lStack_540 = 0;
      local_428[0] = 1;
      local_428[1] = 1;
      local_468[0] = local_3e8[0];
      local_468[1] = local_3e8[0] * local_3e8[1];
      if (2 < local_4c0[0]) {
        memset(local_538,0,local_4c0[0] * 8 - 0x10);
        lVar8 = 2;
        lVar7 = local_468[1];
        lVar9 = local_428[1];
        do {
          lVar9 = lVar9 * ((local_4c0[lVar8] - (&uStack_510)[lVar8]) + 1);
          lVar7 = lVar7 * local_3e8[lVar8];
          local_428[lVar8] = lVar9;
          local_468[lVar8] = lVar7;
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      lVar9 = local_4c0[1];
      lVar7 = local_508[0];
      switch(lVar11) {
      case 0x3e9:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              lVar15 = 0;
              do {
                *(int *)(pcVar3 + lVar15 * 4 + lVar13 * 4) =
                     *(int *)(pcVar3 + lVar15 * 4 + lVar13 * 4) * *alpha;
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
        break;
      case 0x3ea:
        if (0 < lVar14) {
          lVar11 = 0;
          do {
            if (lVar6 < 2) {
              lVar7 = 0;
            }
            else {
              lVar9 = 0;
              lVar7 = 0;
              do {
                lVar8 = *(long *)(local_538 + lVar9 * 8 + -8);
                if ((lVar11 + 1) % local_428[lVar9 + 1] == 0) {
                  *(long *)(local_538 + lVar9 * 8 + -8) = lVar8 + 1;
                }
                lVar7 = lVar7 + lVar8 * local_468[lVar9];
                lVar8 = 0;
                if (*(long *)(local_538 + lVar9 * 8 + -8) <=
                    local_4c0[lVar9 + 2] - local_508[lVar9 + 1]) {
                  lVar8 = *(long *)(local_538 + lVar9 * 8 + -8);
                }
                *(long *)(local_538 + lVar9 * 8 + -8) = lVar8;
                lVar9 = lVar9 + 1;
              } while (lVar6 + -1 != lVar9);
            }
            if (local_508[0] <= local_4c0[1]) {
              lVar9 = -1;
              do {
                *(long *)(pcVar3 + lVar9 * 8 + lVar7 * 8 + 8) =
                     *(long *)(pcVar3 + lVar9 * 8 + lVar7 * 8 + 8) * *alpha;
                lVar9 = lVar9 + 1;
              } while (lVar9 < local_4c0[1] - local_508[0]);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar14);
        }
        break;
      case 0x3eb:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              lVar15 = 0;
              do {
                *(float *)(pcVar3 + lVar15 * 4 + lVar13 * 4) =
                     *alpha * *(float *)(pcVar3 + lVar15 * 4 + lVar13 * 4);
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
        break;
      case 0x3ec:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              lVar15 = 0;
              do {
                *(double *)(pcVar3 + lVar15 * 8 + lVar13 * 8) =
                     *alpha * *(double *)(pcVar3 + lVar15 * 8 + lVar13 * 8);
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
        break;
      default:
        pnga_error(" wrong data type ",lVar11);
        break;
      case 0x3ee:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              lVar15 = 0;
              do {
                fVar17 = (float)*alpha;
                fVar18 = (float)((ulong)*alpha >> 0x20);
                *(ulong *)(pcVar3 + lVar15 * 8 + lVar13 * 8) =
                     CONCAT44(*(float *)(pcVar3 + lVar15 * 8 + lVar13 * 8) * fVar18 +
                              fVar17 * *(float *)(pcVar3 + lVar15 * 8 + lVar13 * 8 + 4),
                              *(float *)(pcVar3 + lVar15 * 8 + lVar13 * 8) * fVar17 +
                              fVar18 * -*(float *)(pcVar3 + lVar15 * 8 + lVar13 * 8 + 4));
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
        break;
      case 0x3ef:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              pauVar12 = (undefined1 (*) [16])(pcVar3 + lVar13 * 0x10);
              lVar13 = lVar11 + 1;
              do {
                dVar2 = *(double *)*pauVar12 * *(double *)((long)alpha + 8) +
                        *alpha * *(double *)(*pauVar12 + 8);
                auVar1._8_4_ = SUB84(dVar2,0);
                auVar1._0_8_ = *(double *)*pauVar12 * *alpha +
                               *(double *)((long)alpha + 8) * -*(double *)(*pauVar12 + 8);
                auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
                *pauVar12 = auVar1;
                pauVar12 = pauVar12 + 1;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
        break;
      case 0x3f8:
        if (0 < lVar14) {
          lVar11 = local_4c0[1] - local_508[0];
          lVar8 = 0;
          do {
            if (lVar6 < 2) {
              lVar13 = 0;
            }
            else {
              lVar15 = 0;
              lVar13 = 0;
              do {
                lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                if ((lVar8 + 1) % local_428[lVar15 + 1] == 0) {
                  *(long *)(local_538 + lVar15 * 8 + -8) = lVar10 + 1;
                }
                lVar13 = lVar13 + lVar10 * local_468[lVar15];
                lVar10 = 0;
                if (*(long *)(local_538 + lVar15 * 8 + -8) <=
                    local_4c0[lVar15 + 2] - local_508[lVar15 + 1]) {
                  lVar10 = *(long *)(local_538 + lVar15 * 8 + -8);
                }
                *(long *)(local_538 + lVar15 * 8 + -8) = lVar10;
                lVar15 = lVar15 + 1;
              } while (lVar6 + -1 != lVar15);
            }
            if (lVar7 <= lVar9) {
              lVar15 = 0;
              do {
                *(long *)(pcVar3 + lVar15 * 8 + lVar13 * 8) =
                     *(long *)(pcVar3 + lVar15 * 8 + lVar13 * 8) * *alpha;
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar14);
        }
      }
    }
    iVar4 = pnga_local_iterator_next(&local_330,local_508,local_4c0 + 1,&local_550,local_3e8);
    lVar11 = local_4c0[0];
  } while( true );
  lVar6 = lVar6 + 1;
  if (lVar11 == lVar6) goto LAB_00169e30;
  goto LAB_00169d77;
}

Assistant:

void pnga_scale_patch(Integer g_a, Integer *lo, Integer *hi, void *alpha)
{
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM];
  Integer ld[MAXDIM];
  char *src_data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&src_data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            src_data_ptr = (void*)((int*)src_data_ptr + offset);
            break;
          case C_DCPL:
            src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
            break;
          case C_SCPL:
            src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
            break;
          case C_DBL:
            src_data_ptr = (void*)((double*)src_data_ptr + offset);
            break;
          case C_FLOAT:
            src_data_ptr = (void*)((float*)src_data_ptr + offset);
            break;     
          case C_LONG:
            src_data_ptr = (void*)((long*)src_data_ptr + offset);
            break;                          
          case C_LONGLONG:
            src_data_ptr = (void*)((long long*)src_data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);
    }

  }
#else
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, loA, hiA);

    /* determine subset of my patch to access */
    if (pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      pnga_access_ptr(g_a, loA, hiA, &src_data_ptr, ld);

      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA); 
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of VISIBLE patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get src_data_ptr to corner of patch */
          /* ld are leading dimensions INCLUDING ghost cells */
          pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();   
}